

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::verified(torrent *this,piece_index_t piece)

{
  this->m_num_verified = this->m_num_verified + 1;
  bitfield::set_bit(&(this->m_verified).super_bitfield,piece.m_val);
  set_need_save_resume(this,(resume_data_flags_t)0x10);
  return;
}

Assistant:

void torrent::verified(piece_index_t const piece)
	{
		TORRENT_ASSERT(!m_verified.get_bit(piece));
		++m_num_verified;
		m_verified.set_bit(piece);
		set_need_save_resume(torrent_handle::if_download_progress);
	}